

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void duckdb_je_arena_migrate(tsd_t *tsd,arena_t *oldarena,arena_t *newarena)

{
  uint uVar1;
  
  duckdb_je_arena_nthreads_dec(oldarena,false);
  duckdb_je_arena_nthreads_inc(newarena,false);
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena = newarena;
  uVar1 = duckdb_je_arena_nthreads_get(oldarena,false);
  if (uVar1 != 0) {
    return;
  }
  duckdb_je_arena_decay((tsdn_t *)tsd,oldarena,false,true);
  return;
}

Assistant:

void
arena_migrate(tsd_t *tsd, arena_t *oldarena, arena_t *newarena) {
	assert(oldarena != NULL);
	assert(newarena != NULL);

	arena_nthreads_dec(oldarena, false);
	arena_nthreads_inc(newarena, false);
	tsd_arena_set(tsd, newarena);

	if (arena_nthreads_get(oldarena, false) == 0) {
		/* Purge if the old arena has no associated threads anymore. */
		arena_decay(tsd_tsdn(tsd), oldarena,
		    /* is_background_thread */ false, /* all */ true);
	}
}